

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

UniValue * __thiscall CRPCTable::execute(CRPCTable *this,JSONRPCRequest *request)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  JSONRPCRequest *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *result;
  const_iterator it;
  UniqueLock<GlobalMutex> criticalblock16;
  UniValue *in_stack_ffffffffffffff38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  *in_stack_ffffffffffffff40;
  _Self *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff5b;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  UniValue *result_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar5;
  uint in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result_00 = in_RDI;
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff38);
  UniqueLock<GlobalMutex>::UniqueLock
            ((UniqueLock<GlobalMutex> *)in_RSI,(GlobalMutex *)result_00,(char *)in_RDI,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(bool)in_stack_ffffffffffffff5b);
  if ((fRPCInWarmup & 1U) == 0) {
    UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff38);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
    ::find(in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
    ::end(in_stack_ffffffffffffff40);
    bVar2 = std::operator==(in_stack_ffffffffffffff48,(_Self *)in_stack_ffffffffffffff40);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 & 0xffffff;
      UniValue::UniValue(in_stack_ffffffffffffff38);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                    *)in_stack_ffffffffffffff38);
      bVar2 = ExecuteCommands((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RSI,
                              result_00);
      if (bVar2) {
        in_stack_ffffffffffffff88 = CONCAT13(1,(int3)in_stack_ffffffffffffff88);
      }
      uVar5 = (uint)bVar2;
      if ((in_stack_ffffffffffffff88 & 0x1000000) == 0) {
        UniValue::~UniValue(in_stack_ffffffffffffff38);
      }
      if (uVar5 != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return result_00;
        }
        goto LAB_00718823;
      }
      in_stack_ffffffffffffff84 = 0;
    }
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff80);
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (char *)CONCAT44(in_stack_ffffffffffffff84,uVar4),(allocator<char> *)in_RSI);
    JSONRPCError(in_stack_ffffffffffffff8c,(string *)in_RSI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    uVar3 = __cxa_allocate_exception(0x58);
    JSONRPCError(in_stack_ffffffffffffff8c,(string *)in_RSI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00718823:
  __stack_chk_fail();
}

Assistant:

UniValue CRPCTable::execute(const JSONRPCRequest &request) const
{
    // Return immediately if in warmup
    {
        LOCK(g_rpc_warmup_mutex);
        if (fRPCInWarmup)
            throw JSONRPCError(RPC_IN_WARMUP, rpcWarmupStatus);
    }

    // Find method
    auto it = mapCommands.find(request.strMethod);
    if (it != mapCommands.end()) {
        UniValue result;
        if (ExecuteCommands(it->second, request, result)) {
            return result;
        }
    }
    throw JSONRPCError(RPC_METHOD_NOT_FOUND, "Method not found");
}